

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

void __thiscall Assimp::Q3BSPFileImporter::~Q3BSPFileImporter(Q3BSPFileImporter *this)

{
  ~Q3BSPFileImporter(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

Q3BSPFileImporter::~Q3BSPFileImporter() {
    m_pCurrentMesh = nullptr;
    m_pCurrentFace = nullptr;

    // Clear face-to-material map
    for ( FaceMap::iterator it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end(); ++it ) {
        const std::string &matName = it->first;
        if ( !matName.empty() ) {
            delete it->second;
        }
    }
    m_MaterialLookupMap.clear();
}